

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O2

void rcg::checkFeature(shared_ptr<GenApi_3_4::CNodeMapRef> *nodemap,char *name,char *value,
                      bool igncache)

{
  bool bVar1;
  ostream *poVar2;
  invalid_argument *this;
  bool in_R9B;
  string cvalue;
  string local_1b8 [32];
  ostringstream out;
  
  getString_abi_cxx11_
            (&cvalue,(rcg *)nodemap,(shared_ptr<GenApi_3_4::CNodeMapRef> *)name,(char *)0x1,igncache
             ,in_R9B);
  bVar1 = std::operator!=(&cvalue,"");
  if (bVar1) {
    bVar1 = std::operator!=(&cvalue,value);
    if (bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&out);
      poVar2 = std::operator<<((ostream *)&out,name);
      poVar2 = std::operator<<(poVar2," == ");
      poVar2 = std::operator<<(poVar2,value);
      poVar2 = std::operator<<(poVar2," expected: ");
      std::operator<<(poVar2,(string *)&cvalue);
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::invalid_argument::invalid_argument(this,local_1b8);
      __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  std::__cxx11::string::~string((string *)&cvalue);
  return;
}

Assistant:

void checkFeature(const std::shared_ptr<GenApi::CNodeMapRef> &nodemap, const char *name,
                  const char *value, bool igncache)
{
  std::string cvalue=getString(nodemap, name, true, igncache);

  if (cvalue != "" && cvalue != value)
  {
    std::ostringstream out;
    out << name << " == " << value << " expected: " << cvalue;
    throw std::invalid_argument(out.str());
  }
}